

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

void jpeg_save_markers(j_decompress_ptr cinfo,int marker_code,uint length_limit)

{
  jpeg_marker_reader *pjVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  code *pcVar4;
  uint uVar5;
  long lVar6;
  
  pjVar1 = cinfo->marker;
  lVar6 = cinfo->mem->max_alloc_chunk + -0x20;
  uVar5 = (uint)lVar6;
  if ((long)(ulong)length_limit <= lVar6) {
    uVar5 = length_limit;
  }
  if (uVar5 == 0) {
    pcVar4 = skip_variable;
    if (marker_code == 0xee) {
      pcVar4 = get_interesting_appn;
    }
    if (marker_code == 0xe0) {
      pcVar4 = get_interesting_appn;
    }
    uVar3 = 0;
  }
  else {
    if ((marker_code == 0xe0) && (uVar5 < 0xe)) {
      pcVar4 = save_marker;
      uVar3 = 0xe;
      goto LAB_00124669;
    }
    uVar3 = 0xc;
    if (0xc < uVar5) {
      uVar3 = uVar5;
    }
    if (marker_code != 0xee) {
      uVar3 = uVar5;
    }
    pcVar4 = save_marker;
  }
  if (marker_code == 0xfe) {
    pjVar1[1].reset_marker_reader = pcVar4;
    *(uint *)&pjVar1[4].read_restart_marker = uVar3;
    return;
  }
  if ((marker_code & 0xfffffff0U) != 0xe0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x44;
    (pjVar2->msg_parm).i[0] = marker_code;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    return;
  }
LAB_00124669:
  (&pjVar1[1].read_markers)[marker_code - 0xe0] = pcVar4;
  *(uint *)((long)&pjVar1[4].read_restart_marker + (ulong)(marker_code - 0xe0) * 4 + 4) = uVar3;
  return;
}

Assistant:

GLOBAL(void)
jpeg_save_markers(j_decompress_ptr cinfo, int marker_code,
                  unsigned int length_limit)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  long maxlength;
  jpeg_marker_parser_method processor;

  /* Length limit mustn't be larger than what we can allocate
   * (should only be a concern in a 16-bit environment).
   */
  maxlength = cinfo->mem->max_alloc_chunk - sizeof(struct jpeg_marker_struct);
  if (((long)length_limit) > maxlength)
    length_limit = (unsigned int)maxlength;

  /* Choose processor routine to use.
   * APP0/APP14 have special requirements.
   */
  if (length_limit) {
    processor = save_marker;
    /* If saving APP0/APP14, save at least enough for our internal use. */
    if (marker_code == (int)M_APP0 && length_limit < APP0_DATA_LEN)
      length_limit = APP0_DATA_LEN;
    else if (marker_code == (int)M_APP14 && length_limit < APP14_DATA_LEN)
      length_limit = APP14_DATA_LEN;
  } else {
    processor = skip_variable;
    /* If discarding APP0/APP14, use our regular on-the-fly processor. */
    if (marker_code == (int)M_APP0 || marker_code == (int)M_APP14)
      processor = get_interesting_appn;
  }

  if (marker_code == (int)M_COM) {
    marker->process_COM = processor;
    marker->length_limit_COM = length_limit;
  } else if (marker_code >= (int)M_APP0 && marker_code <= (int)M_APP15) {
    marker->process_APPn[marker_code - (int)M_APP0] = processor;
    marker->length_limit_APPn[marker_code - (int)M_APP0] = length_limit;
  } else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}